

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O2

QTextStream * __thiscall
QDBusXmlToCpp::writeHeader(QDBusXmlToCpp *this,QTextStream *ts,bool changesWillBeLost)

{
  QTextStream *pQVar1;
  undefined3 in_register_00000011;
  char *pcVar2;
  long in_FS_OFFSET;
  QFileInfo local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QTextStream *)
           QTextStream::operator<<
                     (ts,
                      "/*\n * This file was generated by qdbusxml2cpp version 0.8\n * Source file was "
                     );
  QFileInfo::QFileInfo(local_50,(QString *)&this->inputFile);
  QFileInfo::fileName();
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)&local_48);
  QTextStream::operator<<
            (pQVar1,
             "\n *\n * qdbusxml2cpp is Copyright (C) The Qt Company Ltd. and other contributors.\n *\n * This is an auto-generated file.\n"
            );
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QFileInfo::~QFileInfo(local_50);
  pcVar2 = 
  " * This file may have been hand-edited. Look for HAND-EDIT comments\n * before re-generating it.\n"
  ;
  if (CONCAT31(in_register_00000011,changesWillBeLost) != 0) {
    pcVar2 = " * Do not edit! All changes made to it will be lost.\n";
  }
  QTextStream::operator<<(ts,pcVar2);
  QTextStream::operator<<(ts," */\n\n");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return ts;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QDBusXmlToCpp::writeHeader(QTextStream &ts, bool changesWillBeLost)
{
    ts << "/*\n"
          " * This file was generated by " PROGRAMNAME " version " PROGRAMVERSION "\n"
          " * Source file was " << QFileInfo(inputFile).fileName() << "\n"
          " *\n"
          " * " PROGRAMNAME " is " PROGRAMCOPYRIGHT "\n"
          " *\n"
          " * This is an auto-generated file.\n";

    if (changesWillBeLost)
        ts << " * Do not edit! All changes made to it will be lost.\n";
    else
        ts << " * This file may have been hand-edited. Look for HAND-EDIT comments\n"
              " * before re-generating it.\n";

    ts << " */\n\n";

    return ts;
}